

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O2

Spectrum __thiscall
CMU462::StaticScene::AreaLight::sample_L
          (AreaLight *this,Vector3D *p,Vector3D *wi,float *distToLight,float *pdf)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  Spectrum SVar9;
  Sampler2D local_48;
  double dStack_40;
  
  UniformGridSampler2D::get_sample((UniformGridSampler2D *)&local_48);
  dVar1 = (double)local_48._vptr_Sampler2D + -0.5;
  dStack_40 = dStack_40 + -0.5;
  dVar4 = ((this->dim_y).z * dStack_40 + (this->position).z + (this->dim_x).z * dVar1) - p->z;
  dVar2 = (dStack_40 * (this->dim_y).x + dVar1 * (this->dim_x).x + (this->position).x) - p->x;
  dVar1 = (dStack_40 * (this->dim_y).y + dVar1 * (this->dim_x).y + (this->position).y) - p->y;
  fVar5 = (float)((this->direction).z * dVar4 +
                 (this->direction).x * dVar2 + (this->direction).y * dVar1);
  fVar6 = (float)(dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1);
  fVar7 = SQRT(fVar6);
  dVar8 = 1.0 / (double)fVar7;
  wi->x = dVar8 * dVar2;
  wi->y = dVar8 * dVar1;
  wi->z = dVar4 * dVar8;
  *distToLight = fVar7;
  *pdf = fVar6 / (ABS(fVar5) * this->area);
  if (fVar5 < 0.0) {
    uVar3._0_4_ = (this->radiance).r;
    uVar3._4_4_ = (this->radiance).g;
  }
  else {
    uVar3 = 0;
  }
  SVar9.b = (float)((uint)(this->radiance).b & -(uint)(fVar5 < 0.0));
  SVar9.r = (float)(int)uVar3;
  SVar9.g = (float)(int)((ulong)uVar3 >> 0x20);
  return SVar9;
}

Assistant:

Spectrum AreaLight::sample_L(const Vector3D& p, Vector3D* wi, 
                             float* distToLight, float* pdf) const {

  Vector2D sample = sampler.get_sample() - Vector2D(0.5f, 0.5f);
  Vector3D d = position + sample.x * dim_x + sample.y * dim_y - p;
  float cosTheta = dot(d, direction);
  float sqDist = d.norm2();
  float dist = sqrt(sqDist);
  *wi = d / dist;
  *distToLight = dist;
  *pdf = sqDist / (area * fabs(cosTheta));
  return cosTheta < 0 ? radiance : Spectrum();
}